

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingAnalyzeState<duckdb::uhugeint_t>::BitpackingAnalyzeState
          (BitpackingAnalyzeState<duckdb::uhugeint_t> *this,CompressionInfo *info)

{
  BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *in_RSI;
  AnalyzeState *in_RDI;
  
  AnalyzeState::AnalyzeState(in_RDI,(CompressionInfo *)in_RSI);
  in_RDI->_vptr_AnalyzeState = (_func_int **)&PTR__BitpackingAnalyzeState_035103f0;
  BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::BitpackingState(in_RSI);
  return;
}

Assistant:

explicit BitpackingAnalyzeState(const CompressionInfo &info) : AnalyzeState(info) {}